

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

void __thiscall
MADPComponentFactoredStates::MADPComponentFactoredStates(MADPComponentFactoredStates *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Scope *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__MADPComponentFactoredStates_00d4cf68;
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xafcd93);
  in_RDI[7] = 0;
  std::vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::vector
            ((vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_> *)0xafcdae);
  Scope::Scope(in_stack_ffffffffffffffc0);
  in_RDI[0xe] = 0;
  pvVar1 = operator_new(0x30);
  std::
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  ::map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
         *)0xafcdeb);
  in_RDI[0xf] = pvVar1;
  return;
}

Assistant:

MADPComponentFactoredStates::MADPComponentFactoredStates() 
    :
        _m_initialized(false)
        , _m_nrStates(0)
        , _m_nrStateFactors(0)
        , _m_stepSize(0)
        , _m_initialStateDistribution(0)
{
    _m_jointStatesMap=new map<vector<Index>, State*>;
}